

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O0

void __thiscall Personality::PrintPersonality(Personality *this)

{
  bool bVar1;
  ostream *poVar2;
  reference ppFVar3;
  reference ppIVar4;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<Item_*> local_38;
  iterator iti;
  _Self local_28;
  _List_node_base *local_20;
  _List_iterator<Follower_*> local_18;
  iterator itf;
  Personality *this_local;
  
  itf._M_node = (_List_node_base *)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"Card: ");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Cost: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->cost);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"Personality Type: ");
  if (this->typeP == ATTACKER) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Attacker");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeP == DEFENDER) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Defender");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeP == SHOGUN) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Shogun");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else if (this->typeP == CHANCELLOR) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Chancellor");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (this->typeP != CHAMPION) {
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"Champion");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((this->tapped & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Tapped: no");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Tapped: yes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((this->revealed & 1U) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Revealed: no");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Revealed: yes");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Attack: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->attack);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Defense: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->defense);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Honour: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->honour);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"Maximum possible followers: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->maxFollowers);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::_List_iterator<Follower_*>::_List_iterator(&local_18);
  bVar1 = std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::empty(&this->followers);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No followers");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_20 = (_List_node_base *)
               std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::begin(&this->followers);
    local_18._M_node = local_20;
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::end(&this->followers);
      bVar1 = std::operator!=(&local_18,&local_28);
      if (!bVar1) break;
      ppFVar3 = std::_List_iterator<Follower_*>::operator*(&local_18);
      Follower::PrintFollower(*ppFVar3);
      iti._M_node = (_List_node_base *)std::_List_iterator<Follower_*>::operator++(&local_18,0);
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Maximum possible items: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->maxItems);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::_List_iterator<Item_*>::_List_iterator(&local_38);
  bVar1 = std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::empty(&this->items);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"No followers");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_40 = (_List_node_base *)
               std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::begin(&this->items);
    local_38._M_node = local_40;
    while( true ) {
      local_48._M_node =
           (_List_node_base *)std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::end(&this->items)
      ;
      bVar1 = std::operator!=(&local_38,&local_48);
      if (!bVar1) break;
      ppIVar4 = std::_List_iterator<Item_*>::operator*(&local_38);
      Item::PrintItem(*ppIVar4);
      std::_List_iterator<Item_*>::operator++(&local_38,0);
    }
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Personality::PrintPersonality()                                //prints personality's card stats
{
    cout << "Card: " << name << endl;
    cout << "Cost: " << cost << endl;

    cout << "Personality Type: ";
    if (typeP == ATTACKER)
        cout << "Attacker" << endl;
    else if (typeP == DEFENDER)
        cout << "Defender" << endl;
    else if (typeP == SHOGUN)
        cout << "Shogun" << endl;
    else if (typeP == CHANCELLOR)
        cout << "Chancellor" << endl;
    else if (typeP == CHAMPION)
        cout << "Champion" << endl;
    else
        return;

    if (tapped)
        cout << "Tapped: yes" << endl;
    else
        cout << "Tapped: no" << endl;

    if (revealed)
        cout << "Revealed: yes" << endl;
    else
        cout << "Revealed: no" << endl;

    cout << "Attack: " << attack << endl;
    cout << "Defense: " << defense << endl;
    cout << "Honour: " << honour << endl;

    cout << "Maximum possible followers: " << maxFollowers << endl;

    list<Follower*>::iterator itf;

    if (followers.empty())
        cout << "No followers" << endl;
    else
    {
        for (itf=followers.begin(); itf!=followers.end(); itf++)
            (*itf)->PrintFollower();
    }

    cout << "Maximum possible items: " << maxItems << endl;

    list<Item*>::iterator iti;

    if (items.empty())
        cout << "No followers" << endl;
    else
    {
        for (iti=items.begin(); iti!=items.end(); iti++)
            (*iti)->PrintItem();
    }
    cout << endl;
}